

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::FrexpCase::compare(FrexpCase *this,void **inputs,void **outputs)

{
  float fVar1;
  Precision PVar2;
  pointer pSVar3;
  uint uVar4;
  ostream *poVar5;
  ostringstream *this_00;
  int iVar6;
  float fVar7;
  deUint32 bBits;
  int iVar8;
  float fVar9;
  FrexpCase *pFVar10;
  float fVar11;
  ulong uVar12;
  bool bVar13;
  deUint32 u32;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar2 = (pSVar3->varType).m_data.basic.precision;
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (0 < (int)uVar4) {
    fVar7 = (float)~(-1 << (0x17 - (&DAT_0096a1bc)[(ulong)PVar2 * 4] & 0x1f));
    uVar12 = 0;
    bVar13 = false;
    pFVar10 = this;
    do {
      fVar1 = *(float *)((long)*inputs + uVar12 * 4);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        pFVar10 = (FrexpCase *)(ulong)((uint)fVar1 & 0x807fffff | 0x3f000000);
        iVar6 = ((uint)fVar1 >> 0x17 & 0xff) - 0x7e;
        iVar8 = iVar6;
        if (((uint)fVar1 & 0x7fffff) != 0) {
          iVar8 = -0x7d;
        }
        if (((uint)fVar1 & 0x7f800000) != 0) {
          iVar8 = iVar6;
        }
      }
      else {
        iVar8 = movmskps((int)pFVar10,ZEXT416((uint)fVar1));
        pFVar10 = (FrexpCase *)(ulong)(uint)(iVar8 << 0x1f);
        iVar8 = 0;
      }
      fVar1 = *(float *)((long)*outputs + uVar12 * 4);
      fVar9 = SUB84(pFVar10,0);
      if (((fVar1 == 0.0) && (fVar11 = fVar9, !NAN(fVar1))) ||
         ((fVar9 == 0.0 && (fVar11 = fVar1, !NAN(fVar9))))) {
        fVar11 = ABS(fVar11);
      }
      else {
        fVar11 = (float)((int)fVar9 - (int)fVar1);
        if ((uint)fVar9 < (uint)fVar1) {
          fVar11 = (float)-((int)fVar9 - (int)fVar1);
        }
      }
      if (((uint)fVar7 < (uint)fVar11) || (*(int *)((long)outputs[1] + uVar12 * 4) != iVar8)) {
        this_00 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        poVar5 = (ostream *)std::ostream::operator<<(this_00,(int)uVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = ",4);
        local_34.value = fVar9;
        poVar5 = Functional::operator<<(poVar5,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," with ULP threshold ",0x14);
        local_40.value = (deUint64)(uint)fVar7;
        poVar5 = tcu::Format::Hex<8UL>::toStream(&local_40,poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", got ULP diff ",0xf);
        local_40.value = (deUint64)(uint)fVar11;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar5);
        return bVar13;
      }
      uVar12 = uVar12 + 1;
      bVar13 = uVar4 <= uVar12;
    } while (uVar12 != uVar4);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type						= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision					= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize					= glu::getDataTypeScalarSize(type);
		const bool				signedZero					= false;

		const int				mantissaBits				= getMinMantissaBits(precision);
		const deUint32			maxUlpDiff					= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const int		out1		= ((const int*)outputs[1])[compNdx];

			float			refOut0;
			int				refOut1;

			frexp(in0, &refOut0, &refOut1);

			const deUint32	ulpDiff0	= signedZero ? getUlpDiff(out0, refOut0) : getUlpDiffIgnoreZeroSign(out0, refOut0);

			if (ulpDiff0 > maxUlpDiff || out1 != refOut1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(refOut0) << ", " << refOut1 << " with ULP threshold "
						  << tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff0);
				return false;
			}
		}

		return true;
	}